

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O1

bool __thiscall
QDockWidgetPrivate::mouseDoubleClickEvent(QDockWidgetPrivate *this,QMouseEvent *event)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  undefined4 uVar4;
  uint uVar5;
  QDockWidgetLayout *this_00;
  ulong uVar6;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar7 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar8 [16];
  ulong local_40;
  QPoint local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QDockWidgetLayout *)QMetaObject::cast((QObject *)&QDockWidgetLayout::staticMetaObject);
  bVar2 = QDockWidgetLayout::nativeWindowDeco(this_00);
  if (!bVar2) {
    local_38.xp.m_i = (this_00->_titleArea).x1.m_i;
    local_38.yp.m_i = (this_00->_titleArea).y1.m_i;
    uStack_30._0_4_ = (this_00->_titleArea).x2;
    uStack_30._4_4_ = (this_00->_titleArea).y2;
    if (*(int *)(event + 0x40) == 1) {
      uVar4 = QEventPoint::position();
      auVar8._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                     extraout_XMM1_Qa;
      auVar8._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                     extraout_XMM0_Qa;
      auVar8 = minpd(_DAT_0066f5d0,auVar8);
      auVar7._8_8_ = -(ulong)(-2147483648.0 < auVar8._8_8_);
      auVar7._0_8_ = -(ulong)(-2147483648.0 < auVar8._0_8_);
      uVar5 = movmskpd(uVar4,auVar7);
      uVar6 = 0x8000000000000000;
      if ((uVar5 & 1) != 0) {
        uVar6 = (ulong)(uint)(int)auVar8._0_8_ << 0x20;
      }
      local_40 = 0x80000000;
      if ((uVar5 & 2) != 0) {
        local_40 = (ulong)(uint)(int)auVar8._8_8_;
      }
      local_40 = local_40 | uVar6;
      cVar3 = QRect::contains(&local_38,SUB81(&local_40,0));
      if ((cVar3 != '\0') &&
         (((this->features).super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
           super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 4) != 0)) {
        lVar1 = *(long *)&(this->super_QWidgetPrivate).field_0x8;
        setFloating(*(QDockWidgetPrivate **)(lVar1 + 8),
                    (*(byte *)(*(long *)(lVar1 + 0x20) + 0xc) & 1) == 0);
        bVar2 = true;
        goto LAB_00407dd3;
      }
    }
  }
  bVar2 = false;
LAB_00407dd3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QDockWidgetPrivate::mouseDoubleClickEvent(QMouseEvent *event)
{
    QDockWidgetLayout *dwLayout = qobject_cast<QDockWidgetLayout*>(layout);

    if (!dwLayout->nativeWindowDeco()) {
        QRect titleArea = dwLayout->titleArea();

        if (event->button() == Qt::LeftButton && titleArea.contains(event->position().toPoint()) &&
            hasFeature(this, QDockWidget::DockWidgetFloatable)) {
            toggleTopLevel();
            return true;
        }
    }
    return false;
}